

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<char[8],char[38]>
               (ostream *out,char *fmt,char (*args) [8],char (*args_1) [38])

{
  long lVar1;
  ostream *in_RSI;
  char (*in_RDI) [8];
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<char[8],char[38]>(in_RDI,(char (*) [38])in_stack_ffffffffffffff78);
  vformat(in_RSI,*in_RDI,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}